

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O2

void __thiscall
glslang::HlslParseContext::growGlobalUniformBlock
          (HlslParseContext *this,TSourceLoc *loc,TType *memberType,TString *memberName,
          TTypeList *newTypeList)

{
  int iVar1;
  undefined4 extraout_var;
  iterator iVar2;
  HlslParseContext *this_00;
  _Base_ptr typeList;
  TTypeList *local_30;
  
  this_00 = (HlslParseContext *)memberType;
  iVar1 = (*memberType->_vptr_TType[10])();
  correctUniform(this_00,(TQualifier *)CONCAT44(extraout_var,iVar1));
  iVar1 = (*memberType->_vptr_TType[0x25])(memberType);
  if ((char)iVar1 != '\0') {
    local_30 = TType::getStruct(memberType);
    iVar2 = std::
            _Rb_tree<const_glslang::TVector<glslang::TTypeLoc>_*,_std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>,_std::_Select1st<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>_>
            ::find((_Rb_tree<const_glslang::TVector<glslang::TTypeLoc>_*,_std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>,_std::_Select1st<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>_>
                    *)&this->ioTypeMap,&local_30);
    if ((_Rb_tree_header *)iVar2._M_node !=
        &(this->ioTypeMap).
         super_map<const_glslang::TVector<glslang::TTypeLoc>_*,_glslang::HlslParseContext::tIoKinds,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>_>
         ._M_t._M_impl.super__Rb_tree_header) {
      typeList = iVar2._M_node[1]._M_right;
      goto LAB_00385d98;
    }
  }
  typeList = (_Base_ptr)0x0;
LAB_00385d98:
  TParseContextBase::growGlobalUniformBlock
            (&this->super_TParseContextBase,loc,memberType,memberName,(TTypeList *)typeList);
  return;
}

Assistant:

void HlslParseContext::growGlobalUniformBlock(const TSourceLoc& loc, TType& memberType, const TString& memberName,
                                              TTypeList* newTypeList)
{
    newTypeList = nullptr;
    correctUniform(memberType.getQualifier());
    if (memberType.isStruct()) {
        auto it = ioTypeMap.find(memberType.getStruct());
        if (it != ioTypeMap.end() && it->second.uniform)
            newTypeList = it->second.uniform;
    }
    TParseContextBase::growGlobalUniformBlock(loc, memberType, memberName, newTypeList);
}